

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<char_*> *this;
  byte bVar1;
  ushort uVar2;
  initializer_list<char_*> __l;
  FILE *pFVar3;
  ulong uVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  reference pvVar10;
  vector<char_*,_std::allocator<char_*>_> *pvVar11;
  size_type sVar12;
  reference puVar13;
  char *pcVar14;
  reference pvVar15;
  reference ppcVar16;
  const_reference pvVar17;
  byte *pbVar18;
  reference pvVar19;
  anon_class_1_0_00000001 local_159;
  reference paStack_158;
  anon_class_1_0_00000001 printPath;
  array<Rgba,_4UL> *pal;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *__range3_1;
  uchar c;
  uint8_t _;
  ulong uStack_130;
  uint16_t row;
  size_t i_1;
  vector<char_*,_std::allocator<char_*>_> *pvStack_120;
  anon_class_1_0_00000001 autoOutPath;
  vector<char_*,_std::allocator<char_*>_> *vec;
  value_type pcStack_110;
  int i;
  char *local_108;
  unsigned_long local_100;
  size_t ofs;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  path local_d8;
  undefined1 local_b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  char *local_90;
  iterator local_88;
  size_type local_80;
  vector<char_*,_std::allocator<char_*>_> local_78;
  reference local_60;
  AtFileStackEntry *stackEntry;
  char *local_48;
  char *atFileName;
  char **curArgv;
  undefined1 local_30 [4];
  int curArgc;
  vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> atFileStack;
  char **argv_local;
  int argc_local;
  
  atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::vector
            ((vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> *)local_30);
  atFileName = (char *)atFileStack.
                       super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
  curArgv._4_4_ = argc;
  while( true ) {
    while (local_48 = parseArgv(curArgv._4_4_,(char **)atFileName), local_48 != (char *)0x0) {
      local_88 = &local_90;
      local_80 = 1;
      this = (allocator<char_*> *)
             ((long)&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      local_90 = local_48;
      std::allocator<char_*>::allocator(this);
      __l._M_len = local_80;
      __l._M_array = local_88;
      std::vector<char_*,_std::allocator<char_*>_>::vector(&local_78,__l,this);
      pvVar10 = std::vector<main::AtFileStackEntry,std::allocator<main::AtFileStackEntry>>::
                emplace_back<int&,std::vector<char*,std::allocator<char*>>>
                          ((vector<main::AtFileStackEntry,std::allocator<main::AtFileStackEntry>> *)
                           local_30,&musl_optind,&local_78);
      std::vector<char_*,_std::allocator<char_*>_>::~vector(&local_78);
      std::allocator<char_*>::~allocator
                ((allocator<char_*> *)
                 ((long)&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(musl_optarg + 1);
      local_60 = pvVar10;
      std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                (&local_d8,(char **)&__range3,auto_format);
      readAtFile((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0,&local_d8,
                 &local_60->argPool);
      std::filesystem::__cxx11::path::~path(&local_d8);
      pvVar11 = &local_60->argv;
      sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
      std::vector<char_*,_std::allocator<char_*>_>::reserve(pvVar11,sVar12 + 2);
      __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
      ofs = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
      while (bVar5 = __gnu_cxx::
                     operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&ofs), ((bVar5 ^ 0xffU) & 1) != 0) {
        puVar13 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&__end3);
        local_100 = *puVar13;
        pvVar11 = &local_60->argv;
        local_108 = std::vector<char,_std::allocator<char>_>::data(&local_60->argPool);
        local_108 = local_108 + local_100;
        std::vector<char_*,_std::allocator<char_*>_>::push_back(pvVar11,&local_108);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end3);
      }
      pcStack_110 = (value_type)0x0;
      std::vector<char_*,_std::allocator<char_*>_>::push_back
                (&local_60->argv,&stack0xfffffffffffffef0);
      sVar12 = std::vector<char_*,_std::allocator<char_*>_>::size(&local_60->argv);
      curArgv._4_4_ = (int)sVar12 + -1;
      atFileName = (char *)std::vector<char_*,_std::allocator<char_*>_>::data(&local_60->argv);
      musl_optind = 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    }
    if (musl_optind != curArgv._4_4_) {
      if (curArgv._4_4_ <= musl_optind) {
        __assert_fail("musl_optind < curArgc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/main.cpp"
                      ,0x276,"main");
      }
      for (vec._4_4_ = musl_optind; vec._4_4_ < curArgv._4_4_; vec._4_4_ = vec._4_4_ + 1) {
        registerInput(*(char **)(&(atFileStack.
                                   super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->parentInd +
                                (long)vec._4_4_ * 2));
      }
    }
    bVar5 = std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::empty
                      ((vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> *)local_30);
    if (bVar5) break;
    pvVar10 = std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::back
                        ((vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> *)local_30);
    musl_optind = pvVar10->parentInd;
    std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::pop_back
              ((vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> *)local_30);
    bVar5 = std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::empty
                      ((vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> *)local_30);
    if (bVar5) {
      atFileName = (char *)atFileStack.
                           super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
      curArgv._4_4_ = argc;
    }
    else {
      pvVar10 = std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::back
                          ((vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> *)local_30);
      pvStack_120 = &pvVar10->argv;
      sVar12 = std::vector<char_*,_std::allocator<char_*>_>::size(pvStack_120);
      curArgv._4_4_ = (int)sVar12;
      atFileName = (char *)std::vector<char_*,_std::allocator<char_*>_>::data(pvStack_120);
    }
  }
  if (options.nbColorsPerPal == '\0') {
    options.nbColorsPerPal = (uint8_t)(1 << (options.bitDepth & 0x1f));
  }
  else if ((uint)(1 << (options.bitDepth & 0x1f)) < (uint)options.nbColorsPerPal) {
    error("%ubpp palettes can only contain %u colors, not %u",(ulong)options.bitDepth,
          (ulong)(uint)(1 << (options.bitDepth & 0x1f)),(ulong)options.nbColorsPerPal);
  }
  i_1._7_1_ = 0;
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&i_1 + 7),(bool)(localOptions.autoAttrmap & 1),
             &options.attrmap,".attrmap");
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&i_1 + 7),(bool)(localOptions.autoTilemap & 1),
             &options.tilemap,".tilemap");
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&i_1 + 7),(bool)(localOptions.autoPalettes & 1),
             &options.palettes,".pal");
  main::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&i_1 + 7),(bool)(localOptions.autoPalmap & 1),
             &options.palmap,".palmap");
  if (localOptions.externalPalSpec != (char *)0x0) {
    parseExternalPalSpec(localOptions.externalPalSpec);
  }
  pFVar3 = _stderr;
  if (options.verbosity != '\0') {
    pcVar14 = get_package_version_string();
    fprintf(pFVar3,"rgbgfx %s\n",pcVar14);
    if (5 < options.verbosity) {
      putc(10,_stderr);
      for (uStack_130 = 0; uVar4 = uStack_130,
          sVar12 = std::array<unsigned_short,_21UL>::size(&main::gfx), uVar4 < sVar12;
          uStack_130 = uStack_130 + 1) {
        pvVar15 = std::array<unsigned_short,_21UL>::operator[](&main::gfx,uStack_130);
        __range3_1._6_2_ = *pvVar15;
        for (__range3_1._5_1_ = 0; uVar4 = uStack_130, __range3_1._5_1_ < 10;
            __range3_1._5_1_ = __range3_1._5_1_ + 1) {
          __range3_1._4_1_ = (__range3_1._6_1_ & 1) << 4 | 0x20;
          putc((uint)__range3_1._4_1_,_stderr);
          putc((uint)__range3_1._4_1_,_stderr);
          __range3_1._6_2_ = (value_type_conflict2)((int)(uint)__range3_1._6_2_ >> 1);
        }
        sVar12 = std::array<const_char_*,_3UL>::size(&main::textbox);
        if (uVar4 < sVar12) {
          ppcVar16 = std::array<const_char_*,_3UL>::operator[](&main::textbox,uStack_130);
          fputs(*ppcVar16,_stderr);
        }
        putc(10,_stderr);
      }
      putc(10,_stderr);
    }
    fputs("Options:\n",_stderr);
    if ((options.columnMajor & 1U) != 0) {
      fputs("\tVisit image in column-major order\n",_stderr);
    }
    if ((options.allowMirroring & 1U) != 0) {
      fputs("\tAllow mirroring tiles\n",_stderr);
    }
    if ((options.allowDedup & 1U) != 0) {
      fputs("\tAllow deduplicating tiles\n",_stderr);
    }
    if ((options.useColorCurve & 1U) != 0) {
      fputs("\tUse color curve\n",_stderr);
    }
    fprintf(_stderr,"\tBit depth: %ubpp\n",(ulong)options.bitDepth);
    if (options.trim != 0) {
      fprintf(_stderr,"\tTrim the last %lu tiles\n",options.trim);
    }
    fprintf(_stderr,"\tMaximum %u palettes\n",(ulong)options.nbPalettes);
    fprintf(_stderr,"\tPalettes contain %u colors\n",(ulong)options.nbColorsPerPal);
    pFVar3 = _stderr;
    pcVar14 = main::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&__range3_1 + 3));
    fprintf(pFVar3,"\t%s palette spec\n",pcVar14);
    if (options.palSpecType == EXPLICIT) {
      fputs("\t[\n",_stderr);
      __end3_1 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::begin
                           (&options.palSpec);
      pal = (array<Rgba,_4UL> *)
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::end
                      (&options.palSpec);
      while (bVar5 = __gnu_cxx::
                     operator==<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>
                               (&__end3_1,
                                (__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>
                                 *)&pal), ((bVar5 ^ 0xffU) & 1) != 0) {
        paStack_158 = __gnu_cxx::
                      __normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>
                      ::operator*(&__end3_1);
        pFVar3 = _stderr;
        pvVar17 = std::array<Rgba,_4UL>::operator[](paStack_158,0);
        uVar6 = Rgba::toCSS(pvVar17);
        pvVar17 = std::array<Rgba,_4UL>::operator[](paStack_158,1);
        uVar7 = Rgba::toCSS(pvVar17);
        pvVar17 = std::array<Rgba,_4UL>::operator[](paStack_158,2);
        uVar8 = Rgba::toCSS(pvVar17);
        pvVar17 = std::array<Rgba,_4UL>::operator[](paStack_158,3);
        uVar9 = Rgba::toCSS(pvVar17);
        fprintf(pFVar3,"\t\t#%06x, #%06x, #%06x, #%06x,\n",(ulong)(uVar6 >> 8),(ulong)(uVar7 >> 8),
                (ulong)(uVar8 >> 8),(ulong)(uVar9 >> 8));
        __gnu_cxx::
        __normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>
        ::operator++(&__end3_1);
      }
      fputs("\t]\n",_stderr);
    }
    fprintf(_stderr,"\tInput image slice: %ux%u pixels starting at (%i, %i)\n",
            (ulong)options.inputSlice.width,(ulong)options.inputSlice.height,
            (ulong)options.inputSlice.left,(ulong)options.inputSlice.top);
    pFVar3 = _stderr;
    pbVar18 = std::array<unsigned_char,_2UL>::operator[](&options.baseTileIDs,0);
    bVar1 = *pbVar18;
    pbVar18 = std::array<unsigned_char,_2UL>::operator[](&options.baseTileIDs,1);
    fprintf(pFVar3,"\tBase tile IDs: [%u, %u]\n",(ulong)bVar1,(ulong)*pbVar18);
    pFVar3 = _stderr;
    pvVar19 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
    uVar2 = *pvVar19;
    pvVar19 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,1);
    fprintf(pFVar3,"\tMaximum %u tiles in bank 0, %u in bank 1\n",(ulong)uVar2,(ulong)*pvVar19);
    local_159 = (anon_class_1_0_00000001)0x0;
    main::anon_class_1_0_00000001::operator()(&local_159,"Input image",&options.input);
    main::anon_class_1_0_00000001::operator()(&local_159,"Output tile data",&options.output);
    main::anon_class_1_0_00000001::operator()(&local_159,"Output tilemap",&options.tilemap);
    main::anon_class_1_0_00000001::operator()(&local_159,"Output attrmap",&options.attrmap);
    main::anon_class_1_0_00000001::operator()(&local_159,"Output palettes",&options.palettes);
    fputs("Ready.\n",_stderr);
  }
  if (nbErrors == 0) {
    bVar5 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.input);
    if (bVar5) {
      bVar5 = Options::reverse(&options);
      if (bVar5) {
        reverse();
      }
      else {
        process();
      }
    }
    else {
      bVar5 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.palettes);
      if (((!bVar5) || (options.palSpecType != EXPLICIT)) ||
         (bVar5 = Options::reverse(&options), bVar5)) {
        fputs("FATAL: No input image specified\n",_stderr);
        printUsage();
        exit(1);
      }
      processPalettes();
    }
    if (nbErrors == 0) {
      std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::~vector
                ((vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> *)local_30);
      return 0;
    }
    giveUp();
  }
  giveUp();
}

Assistant:

int main(int argc, char *argv[]) {
	struct AtFileStackEntry {
		int parentInd; // Saved offset into parent argv
		std::vector<char *> argv; // This context's arg pointer vec
		std::vector<char> argPool;

		AtFileStackEntry(int parentInd_, std::vector<char *> argv_)
		    : parentInd(parentInd_), argv(argv_) {}
	};
	std::vector<AtFileStackEntry> atFileStack;

	int curArgc = argc;
	char **curArgv = argv;
	for (;;) {
		char *atFileName = parseArgv(curArgc, curArgv);
		if (atFileName) {
			// Copy `argv[0]` for error reporting, and because option parsing skips it
			AtFileStackEntry &stackEntry =
			    atFileStack.emplace_back(musl_optind, std::vector{atFileName});
			// It would be nice to compute the char pointers on the fly, but reallocs don't allow
			// that; so we must compute the offsets after the pool is fixed
			auto offsets = readAtFile(&musl_optarg[1], stackEntry.argPool);
			stackEntry.argv.reserve(offsets.size() + 2); // Avoid a bunch of reallocs
			for (size_t ofs : offsets) {
				stackEntry.argv.push_back(&stackEntry.argPool.data()[ofs]);
			}
			stackEntry.argv.push_back(nullptr); // Don't forget the arg vector terminator!

			curArgc = stackEntry.argv.size() - 1;
			curArgv = stackEntry.argv.data();
			musl_optind = 1; // Don't use 0 because we're not scanning a different argv per se
			continue; // Begin scanning that arg vector
		}

		if (musl_optind != curArgc) {
			// This happens if `--` is passed, process the remaining arg(s) as positional
			assert(musl_optind < curArgc);
			for (int i = musl_optind; i < curArgc; ++i) {
				registerInput(argv[i]);
			}
		}

		// Pop off the top stack entry, or end parsing if none
		if (atFileStack.empty()) {
			break;
		}
		// OK to restore `optind` directly, because `optpos` must be 0 right now.
		// (Providing 0 would be a "proper" reset, but we want to resume parsing)
		musl_optind = atFileStack.back().parentInd;
		atFileStack.pop_back();
		if (atFileStack.empty()) {
			curArgc = argc;
			curArgv = argv;
		} else {
			auto &vec = atFileStack.back().argv;
			curArgc = vec.size();
			curArgv = vec.data();
		}
	}

	if (options.nbColorsPerPal == 0) {
		options.nbColorsPerPal = 1u << options.bitDepth;
	} else if (options.nbColorsPerPal > 1u << options.bitDepth) {
		error("%" PRIu8 "bpp palettes can only contain %u colors, not %" PRIu8, options.bitDepth,
		      1u << options.bitDepth, options.nbColorsPerPal);
	}

	auto autoOutPath = [](bool autoOptEnabled, std::optional<std::filesystem::path> &path,
	                      char const *extension) {
		if (autoOptEnabled) {
			auto image = localOptions.groupOutputs ? options.output : options.input;
			if (!image.has_value()) {
				fprintf(stderr, "FATAL: No %s specified\n", localOptions.groupOutputs
				      ? "output tile data file" : "input image");
				printUsage();
				exit(1);
			}
			path.emplace(*image).replace_extension(extension);
		}
	};
	autoOutPath(localOptions.autoAttrmap, options.attrmap, ".attrmap");
	autoOutPath(localOptions.autoTilemap, options.tilemap, ".tilemap");
	autoOutPath(localOptions.autoPalettes, options.palettes, ".pal");
	autoOutPath(localOptions.autoPalmap, options.palmap, ".palmap");

	// Execute deferred external pal spec parsing, now that all other params are known
	if (localOptions.externalPalSpec) {
		parseExternalPalSpec(localOptions.externalPalSpec);
	}

	if (options.verbosity >= Options::VERB_CFG) {
		fprintf(stderr, "rgbgfx %s\n", get_package_version_string());

		if (options.verbosity >= Options::VERB_VVVVVV) {
			putc('\n', stderr);
			static std::array<uint16_t, 21> gfx{
			    0x1FE, 0x3FF, 0x399, 0x399, 0x3FF, 0x3FF, 0x381, 0x3C3, 0x1FE, 0x078, 0x1FE,
			    0x3FF, 0x3FF, 0x3FF, 0x37B, 0x37B, 0x0FC, 0x0CC, 0x1CE, 0x1CE, 0x1CE,
			};
			static std::array<char const *, 3> textbox{
			    "  ,----------------------------------------.",
			    "  | Augh, dimensional interference again?! |",
			    "  `----------------------------------------'"};
			for (size_t i = 0; i < gfx.size(); ++i) {
				uint16_t row = gfx[i];
				for (uint8_t _ = 0; _ < 10; ++_) {
					unsigned char c = row & 1 ? '0' : ' ';
					putc(c, stderr);
					// Double the pixel horizontally, otherwise the aspect ratio looks wrong
					putc(c, stderr);
					row >>= 1;
				}
				if (i < textbox.size()) {
					fputs(textbox[i], stderr);
				}
				putc('\n', stderr);
			}
			putc('\n', stderr);
		}

		fputs("Options:\n", stderr);
		if (options.columnMajor)
			fputs("\tVisit image in column-major order\n", stderr);
		if (options.allowMirroring)
			fputs("\tAllow mirroring tiles\n", stderr);
		if (options.allowDedup)
			fputs("\tAllow deduplicating tiles\n", stderr);
		if (options.useColorCurve)
			fputs("\tUse color curve\n", stderr);
		fprintf(stderr, "\tBit depth: %" PRIu8 "bpp\n", options.bitDepth);
		if (options.trim != 0)
			fprintf(stderr, "\tTrim the last %" PRIu64 " tiles\n", options.trim);
		fprintf(stderr, "\tMaximum %" PRIu8 " palettes\n", options.nbPalettes);
		fprintf(stderr, "\tPalettes contain %" PRIu8 " colors\n", options.nbColorsPerPal);
		fprintf(stderr, "\t%s palette spec\n", []() {
			switch (options.palSpecType) {
			case Options::NO_SPEC:
				return "No";
			case Options::EXPLICIT:
				return "Explicit";
			case Options::EMBEDDED:
				return "Embedded";
			}
			return "???";
		}());
		if (options.palSpecType == Options::EXPLICIT) {
			fputs("\t[\n", stderr);
			for (std::array<Rgba, 4> const &pal : options.palSpec) {
				fprintf(stderr, "\t\t#%06x, #%06x, #%06x, #%06x,\n", pal[0].toCSS() >> 8,
				        pal[1].toCSS() >> 8, pal[2].toCSS() >> 8, pal[3].toCSS() >> 8);
			}
			fputs("\t]\n", stderr);
		}
		fprintf(stderr,
		        "\tInput image slice: %" PRIu32 "x%" PRIu32 " pixels starting at (%" PRIi32
		        ", %" PRIi32 ")\n",
		        options.inputSlice.width, options.inputSlice.height, options.inputSlice.left,
		        options.inputSlice.top);
		fprintf(stderr, "\tBase tile IDs: [%" PRIu8 ", %" PRIu8 "]\n", options.baseTileIDs[0],
		        options.baseTileIDs[1]);
		fprintf(stderr, "\tMaximum %" PRIu16 " tiles in bank 0, %" PRIu16 " in bank 1\n",
		        options.maxNbTiles[0], options.maxNbTiles[1]);
		auto printPath = [](char const *name,
		                    std::optional<std::filesystem::path> const &path) {
			if (path.has_value()) {
				fprintf(stderr, "\t%s: %s\n", name, path->c_str());
			}
		};
		printPath("Input image", options.input);
		printPath("Output tile data", options.output);
		printPath("Output tilemap", options.tilemap);
		printPath("Output attrmap", options.attrmap);
		printPath("Output palettes", options.palettes);
		fputs("Ready.\n", stderr);
	}

	// Do not do anything if option parsing went wrong
	if (nbErrors) {
		giveUp();
	}

	if (options.input.has_value()) {
		if (options.reverse()) {
			reverse();
		} else {
			process();
		}
	} else if (options.palettes.has_value() && options.palSpecType == Options::EXPLICIT
		&& !options.reverse()) {
		processPalettes();
	} else {
		fputs("FATAL: No input image specified\n", stderr);
		printUsage();
		exit(1);
	}

	if (nbErrors) {
		giveUp();
	}
	return 0;
}